

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O2

void __thiscall
VideoEngine::VideoEngine
          (VideoEngine *this,Resources *resources,shared_ptr<renderdesc::Pipeline> *pipeline)

{
  vector<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_> *this_00;
  uint uVar1;
  element_type *peVar2;
  pointer pTVar3;
  pointer pFVar4;
  pointer pbVar5;
  pointer pPVar6;
  bool bVar7;
  PolledTexture *this_01;
  pointer psVar8;
  pointer psVar9;
  int iVar10;
  pointer psVar11;
  pointer pTVar12;
  int i;
  ulong uVar13;
  pointer pbVar14;
  pointer pPVar15;
  pointer pFVar16;
  Framebuffer fb;
  
  this->resources_ = resources;
  std::__shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->pipeline_).super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>
             ,&pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = &this->textures_;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->canvas_)._M_t.
  super___uniq_ptr_impl<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>._M_t.
  super__Tuple_impl<0UL,_VideoEngine::Canvas_*,_std::default_delete<VideoEngine::Canvas>_>.
  super__Head_base<0UL,_VideoEngine::Canvas_*,_false>._M_head_impl = (Canvas *)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar2 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pTVar3 = (peVar2->textures).
           super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar12 = (peVar2->textures).
                 super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                 _M_impl.super__Vector_impl_data._M_start; pTVar12 != pTVar3; pTVar12 = pTVar12 + 1)
  {
    if ((pTVar12->file)._M_string_length == 0) {
      this_01 = (PolledTexture *)operator_new(0x28);
      PolledTexture::PolledTexture(this_01,pTVar12->w,pTVar12->h,pTVar12->pixel_type);
      std::__shared_ptr<PolledTexture,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<PolledTexture,void>
                ((__shared_ptr<PolledTexture,(__gnu_cxx::_Lock_policy)2> *)&fb,this_01);
      std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
      emplace_back<std::shared_ptr<PolledTexture>>
                ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                  *)this_00,(shared_ptr<PolledTexture> *)&fb);
    }
    else {
      Resources::getTexture((Resources *)&fb,(string *)this->resources_);
      std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
      emplace_back<std::shared_ptr<PolledTexture>>
                ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                  *)this_00,(shared_ptr<PolledTexture> *)&fb);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fb.num_targets);
  }
  peVar2 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pFVar4 = (peVar2->framebuffers).
           super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pFVar16 = (peVar2->framebuffers).
                 super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                 ._M_impl.super__Vector_impl_data._M_start; pFVar16 != pFVar4; pFVar16 = pFVar16 + 1
      ) {
    Framebuffer::Framebuffer(&fb);
    glBindFramebuffer(0x8d40,fb.name);
    GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb.name)");
    for (uVar13 = 0; (long)uVar13 < (long)pFVar16->textures_count; uVar13 = uVar13 + 1) {
      uVar1 = pFVar16->textures[uVar13];
      psVar8 = (this->textures_).
               super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)(int)uVar1 < 0) ||
         ((int)((ulong)((long)(this->textures_).
                              super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8) >> 4) <=
          (int)uVar1)) {
        aAppDebugPrintf("[CRASH] Fb texture %d OOB %d (max %d)",uVar13 & 0xffffffff,(ulong)uVar1);
        aAppTerminate(-1);
        psVar8 = (this_00->
                 super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      bVar7 = Framebuffer::attachColorTexture
                        (&fb,(int)uVar13,
                         &(psVar8[(int)uVar1].
                           super___shared_ptr<PolledTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          texture_);
      if (!bVar7) {
        aAppDebugPrintf("[CRASH] Framebuffer %d is not complete",
                        (ulong)((long)(this->framebuffer_).
                                      super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->framebuffer_).
                                     super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        aAppTerminate(-1);
      }
    }
    fb.num_targets = pFVar16->textures_count;
    std::vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>::
    emplace_back<VideoEngine::Framebuffer>(&this->framebuffer_,&fb);
    Framebuffer::~Framebuffer(&fb);
  }
  glBindFramebuffer(0x8d40,0);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, 0)");
  peVar2 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pbVar5 = (peVar2->shader_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar14 = (peVar2->shader_filenames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar5; pbVar14 = pbVar14 + 1
      ) {
    Resources::getShaderSource((Resources *)&fb,(string *)this->resources_);
    std::
    vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
    ::emplace_back<std::shared_ptr<PolledShaderSource>>
              ((vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
                *)&this->sources_,(shared_ptr<PolledShaderSource> *)&fb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fb.num_targets);
  }
  peVar2 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pPVar6 = (peVar2->programs).
           super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar15 = (peVar2->programs).
                 super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                 _M_impl.super__Vector_impl_data._M_start; pPVar15 != pPVar6; pPVar15 = pPVar15 + 1)
  {
    uVar1 = pPVar15->vertex;
    psVar11 = (this->sources_).
              super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar9 = (this->sources_).
             super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (ulong)((long)psVar9 - (long)psVar11) >> 4;
    if (((int)uVar1 < 0) || ((int)uVar13 <= (int)uVar1)) {
      aAppDebugPrintf("[CRASH] Program vertex source OOB %d (max %d)",(ulong)uVar1,
                      uVar13 & 0xffffffff);
      aAppTerminate(-1);
      psVar11 = (this->sources_).
                super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar9 = (this->sources_).
               super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    iVar10 = pPVar15->fragment;
    if ((iVar10 < 0) || ((int)((ulong)((long)psVar9 - (long)psVar11) >> 4) <= iVar10)) {
      aAppDebugPrintf("[CRASH] Program fragment source OOB %d (max %d)");
      aAppTerminate(-1);
      psVar11 = (this->sources_).
                super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = pPVar15->fragment;
    }
    std::vector<PolledShaderProgram,std::allocator<PolledShaderProgram>>::
    emplace_back<Expected<std::__cxx11::string,std::__cxx11::string>(&)(shader::Source_const&),std::shared_ptr<PolledShaderSource>&,std::shared_ptr<PolledShaderSource>&>
              ((vector<PolledShaderProgram,std::allocator<PolledShaderProgram>> *)&this->programs_,
               shaderPreprocessor_abi_cxx11_,psVar11 + pPVar15->vertex,psVar11 + iVar10);
  }
  return;
}

Assistant:

VideoEngine::VideoEngine(Resources &resources, const std::shared_ptr<renderdesc::Pipeline> &pipeline)
	: resources_(resources)
	, pipeline_(pipeline)
{
	for (const auto& t: pipeline->textures) {
		if (t.file.empty()) {
			textures_.emplace_back(std::shared_ptr<PolledTexture>(new PolledTexture(t.w, t.h, t.pixel_type)));
		} else {
			textures_.emplace_back(resources_.getTexture(t.file));
		}
	}

	for (const auto& f: pipeline->framebuffers) {
		Framebuffer fb;
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb.name));
		for (int i = 0; i < f.textures_count; ++i) {
			const int index = f.textures[i];
			if (index < 0 || index >= (int)textures_.size())
				CRASH("Fb texture %d OOB %d (max %d)", i, index, (int)textures_.size());

			if (!fb.attachColorTexture(i, textures_[index]->texture()))
				CRASH("Framebuffer %d is not complete", (int)framebuffer_.size());
		}

		fb.num_targets = f.textures_count;

		framebuffer_.push_back(std::move(fb));
	}

	GL(glBindFramebuffer(GL_FRAMEBUFFER, 0));

	for (const auto& s: pipeline->shader_filenames)
		sources_.emplace_back(resources_.getShaderSource(s));

	for (const auto& p: pipeline->programs) {
		if (p.vertex < 0 || p.vertex >= (int)sources_.size())
			CRASH("Program vertex source OOB %d (max %d)", p.vertex, (int)sources_.size());
		if (p.fragment < 0 || p.fragment >= (int)sources_.size())
			CRASH("Program fragment source OOB %d (max %d)", p.fragment, (int)sources_.size());

		programs_.emplace_back(shaderPreprocessor, sources_[p.vertex], sources_[p.fragment]);
	}
}